

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void forbody(LexState *ls,int base,int line,int nvars,int isnum)

{
  FuncState *fs;
  Dyndata *pDVar1;
  int list;
  int list_00;
  BlockCnt bl;
  BlockCnt local_48;
  
  fs = ls->fs;
  adjustlocalvars(ls,3);
  checknext(ls,0x103);
  if (isnum == 0) {
    list = luaK_jump(fs);
  }
  else {
    list = luaK_codeABx(fs,OP_FORPREP,base,0x1fffe);
  }
  local_48.isloop = '\0';
  local_48.nactvar = fs->nactvar;
  pDVar1 = fs->ls->dyd;
  local_48.firstlabel = (pDVar1->label).n;
  local_48.firstgoto = (pDVar1->gt).n;
  local_48.upval = '\0';
  local_48.previous = fs->bl;
  fs->bl = &local_48;
  adjustlocalvars(ls,nvars);
  luaK_reserveregs(fs,nvars);
  block(ls);
  leaveblock(fs);
  luaK_patchtohere(fs,list);
  if (isnum == 0) {
    luaK_codeABC(fs,OP_TFORCALL,base,0,nvars);
    luaK_fixline(fs,line);
    list_00 = luaK_codeABx(fs,OP_TFORLOOP,base + 2,0x1fffe);
  }
  else {
    list_00 = luaK_codeABx(fs,OP_FORLOOP,base,0x1fffe);
  }
  luaK_patchlist(fs,list_00,list + 1);
  luaK_fixline(fs,line);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isnum) {
  /* forbody -> DO block */
  BlockCnt bl;
  FuncState *fs = ls->fs;
  int prep, endfor;
  adjustlocalvars(ls, 3);  /* control variables */
  checknext(ls, TK_DO);
  prep = isnum ? luaK_codeAsBx(fs, OP_FORPREP, base, NO_JUMP) : luaK_jump(fs);
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  luaK_patchtohere(fs, prep);
  if (isnum)  /* numeric for? */
    endfor = luaK_codeAsBx(fs, OP_FORLOOP, base, NO_JUMP);
  else {  /* generic for */
    luaK_codeABC(fs, OP_TFORCALL, base, 0, nvars);
    luaK_fixline(fs, line);
    endfor = luaK_codeAsBx(fs, OP_TFORLOOP, base + 2, NO_JUMP);
  }
  luaK_patchlist(fs, endfor, prep + 1);
  luaK_fixline(fs, line);
}